

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3PExpr(Parse *pParse,int op,Expr *pLeft,Expr *pRight)

{
  Expr *local_30;
  Expr *p;
  Expr *pRight_local;
  Expr *pLeft_local;
  int op_local;
  Parse *pParse_local;
  
  if (((op == 0x2c) && (pParse->nErr == 0)) && (pParse->eParseMode < 2)) {
    local_30 = sqlite3ExprAnd(pParse->db,pLeft,pRight);
  }
  else {
    local_30 = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x48);
    if (local_30 != (Expr *)0x0) {
      memset(local_30,0,0x48);
      local_30->op = (u8)op;
      local_30->iAgg = -1;
    }
    sqlite3ExprAttachSubtrees(pParse->db,local_30,pLeft,pRight);
  }
  if (local_30 != (Expr *)0x0) {
    sqlite3ExprCheckHeight(pParse,local_30->nHeight);
  }
  return local_30;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3PExpr(
  Parse *pParse,          /* Parsing context */
  int op,                 /* Expression opcode */
  Expr *pLeft,            /* Left operand */
  Expr *pRight            /* Right operand */
){
  Expr *p;
  if( op==TK_AND && pParse->nErr==0 && !IN_RENAME_OBJECT ){
    /* Take advantage of short-circuit false optimization for AND */
    p = sqlite3ExprAnd(pParse->db, pLeft, pRight);
  }else{
    p = sqlite3DbMallocRawNN(pParse->db, sizeof(Expr));
    if( p ){
      memset(p, 0, sizeof(Expr));
      p->op = op & 0xff;
      p->iAgg = -1;
    }
    sqlite3ExprAttachSubtrees(pParse->db, p, pLeft, pRight);
  }
  if( p ) {
    sqlite3ExprCheckHeight(pParse, p->nHeight);
  }
  return p;
}